

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this,QIODevice *device)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  QXmlStreamWriterPrivate *d;
  
  this_00._M_head_impl = (QXmlStreamWriterPrivate *)operator_new(0xe0);
  QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack
            ((QXmlStreamPrivateTagStack *)this_00._M_head_impl);
  (((QXmlStreamPrivateTagStack *)&(this_00._M_head_impl)->q_ptr)->namespaceDeclarations).data =
       (NamespaceDeclaration *)this;
  (this_00._M_head_impl)->device = (QIODevice *)0x0;
  (this_00._M_head_impl)->stringDevice = (QString *)0x0;
  *(ushort *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d =
       *(ushort *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d & 0xfc00;
  ((this_00._M_head_impl)->autoFormattingIndent)._M_dataplus =
       (pointer)((long)&(this_00._M_head_impl)->autoFormattingIndent + 0x10);
  *(undefined4 *)((long)&(this_00._M_head_impl)->autoFormattingIndent + 0x10) = 0x20202020;
  *(size_type *)((long)&(this_00._M_head_impl)->autoFormattingIndent + 8) = 4;
  *(undefined1 *)((long)&(this_00._M_head_impl)->autoFormattingIndent + 0x14) = 0;
  ((this_00._M_head_impl)->emptyNamespace).prefix.m_string = 0;
  ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *)
  ((long)&(this_00._M_head_impl)->emptyNamespace + 8))->data = (Tag *)0x0;
  *(qsizetype *)((long)&(this_00._M_head_impl)->emptyNamespace + 0x10) = 0;
  ((XmlStringRef *)((long)&(this_00._M_head_impl)->emptyNamespace + 0x18))->m_string =
       (QString *)0x0;
  (((QXmlStreamPrivateTagStack *)((long)&(this_00._M_head_impl)->emptyNamespace + 0x20))->
  namespaceDeclarations).data = (NamespaceDeclaration *)0x0;
  *(qsizetype *)((long)&(this_00._M_head_impl)->emptyNamespace + 0x28) = 0;
  (this_00._M_head_impl)->lastNamespaceDeclaration = 1;
  *(undefined4 *)&(((QString *)&(this_00._M_head_impl)->namespacePrefixCount)->d).d = 0;
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>.
  super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  (this_00._M_head_impl)->device = device;
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter(QIODevice *device)
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
    Q_D(QXmlStreamWriter);
    d->device = device;
}